

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

void cpu_m68k_set_fpcr_m68k(CPUM68KState_conflict *env,uint32_t val)

{
  char cVar1;
  
  env->fpcr = val & 0xffff;
  if ((env->features & 0x200) == 0) {
    switch(val >> 6 & 3) {
    case 0:
      cVar1 = 'P';
      break;
    case 1:
      cVar1 = ' ';
      break;
    case 2:
      cVar1 = '@';
      break;
    case 3:
      goto switchD_006eade0_caseD_3;
    }
  }
  else {
    cVar1 = ((val & 0x40) == 0) * ' ' + ' ';
  }
  (env->fp_status).floatx80_rounding_precision = cVar1;
switchD_006eade0_caseD_3:
  (env->fp_status).float_rounding_mode = (char)(0x2010300 >> ((byte)val >> 1 & 0x18));
  return;
}

Assistant:

void cpu_m68k_set_fpcr(CPUM68KState *env, uint32_t val)
{
    env->fpcr = val & 0xffff;

    if (m68k_feature(env, M68K_FEATURE_CF_FPU)) {
        cf_restore_precision_mode(env);
    } else {
        m68k_restore_precision_mode(env);
    }
    restore_rounding_mode(env);
}